

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O2

void * isotree_deserialize_from_raw(char *serialized_model,int nthreads)

{
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> uVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer __p;
  pointer __p_00;
  ostream *poVar4;
  __uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
  this;
  IsoForest *this_00;
  ExtIsoForest *this_01;
  Imputer *this_02;
  runtime_error *prVar5;
  long lVar6;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> optional_metadata;
  size_t sVar7;
  bool has_combined_objects;
  bool is_compatible;
  bool is_isotree_model;
  bool has_metadata;
  bool has_Indexer;
  bool has_Imputer;
  bool has_ExtIsoForest;
  bool has_IsoForest;
  unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_> out;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer_metadata;
  TreesIndexer local_168;
  size_t size_metadata;
  IsoForest local_148;
  ExtIsoForest local_f8;
  Imputer local_a8;
  
  if (serialized_model == (char *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Passed NULL \'serialized_model\' to \'isotree_deserialize_from_raw\'."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    return (void *)0x0;
  }
  is_isotree_model = false;
  is_compatible = false;
  has_combined_objects = false;
  has_IsoForest = false;
  has_ExtIsoForest = false;
  has_Imputer = false;
  has_Indexer = false;
  has_metadata = false;
  size_metadata = 0;
  inspect_serialized_object
            (serialized_model,&is_isotree_model,&is_compatible,&has_combined_objects,&has_IsoForest,
             &has_ExtIsoForest,&has_Imputer,&has_Indexer,&has_metadata,&size_metadata);
  if (((is_isotree_model == true) && (is_compatible == true)) && (has_combined_objects == false)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Serialized model is not compatible.\n");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_148.exp_avg_sep = 0.0;
  local_148.orig_sample_size = 0;
  local_148.missing_action = Fail;
  local_148.scoring_metric = Depth;
  local_148.exp_avg_depth = 0.0;
  local_148.trees.
  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.new_cat_action = Weighted;
  local_148.cat_split_type = SubSet;
  local_148.has_range_penalty = false;
  local_148._65_7_ = 0;
  local_148.trees.
  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.trees.
  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.exp_avg_sep = 0.0;
  local_f8.orig_sample_size = 0;
  local_f8.missing_action = Fail;
  local_f8.scoring_metric = Depth;
  local_f8.exp_avg_depth = 0.0;
  local_f8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.new_cat_action = Weighted;
  local_f8.cat_split_type = SubSet;
  local_f8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.hplanes.
  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.has_range_penalty = false;
  local_f8._65_7_ = 0;
  local_a8.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.col_modes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.col_means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.imputer_tree.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.ncat.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  buffer_metadata._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  local_a8.ncols_numeric = 0;
  local_a8.ncols_categ = 0;
  local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (size_metadata == 0) {
    optional_metadata._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  }
  else {
    __p_00 = (pointer)operator_new__(size_metadata);
    out._M_t.
    super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>.
    _M_t.
    super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
    .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
         (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
          )(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
            )0x0;
    std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&buffer_metadata,__p_00);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&out);
    optional_metadata._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)size_metadata;
    if (size_metadata != 0) {
      optional_metadata._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (tuple<char_*,_std::default_delete<char[]>_>)
           (tuple<char_*,_std::default_delete<char[]>_>)buffer_metadata;
    }
  }
  deserialize_combined
            (serialized_model,&local_148,&local_f8,&local_a8,&local_168,
             (char *)optional_metadata._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl);
  pvVar3 = local_a8.imputer_tree.
           super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = local_a8.imputer_tree.
           super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_148.trees.
            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_148.trees.
            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    if (local_f8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_f8.hplanes.
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Error: model contains no trees.\n");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar7 = 3;
  }
  else {
    sVar7 = 1;
  }
  lVar6 = (long)local_148.trees.
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_148.trees.
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (local_148.trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_148.trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = (long)local_f8.hplanes.
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.hplanes.
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((local_a8.imputer_tree.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       local_a8.imputer_tree.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((long)local_a8.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_a8.imputer_tree.
            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == lVar6)) {
    if ((local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       (((long)local_168.indices.
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)local_168.indices.
              super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x98 == lVar6 / 0x18)) {
      this.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
            )operator_new(0x1d8);
      memset((void *)this.
                     super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                     .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl,0,0x1d8)
      ;
      isotree::IsolationForest::IsolationForest
                ((IsolationForest *)
                 this.
                 super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                 .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl);
      *(int *)this.
              super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              ._M_t.
              super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
              .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl = nthreads;
      *(size_t *)
       ((long)this.
              super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              ._M_t.
              super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
              .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x10) = sVar7
      ;
      *(long *)((long)this.
                      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0x30)
           = lVar6 / 0x18;
      *(bool *)((long)this.
                      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl + 0xa6)
           = pvVar2 != pvVar3;
      out._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
            )(__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
              )this.
               super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
               ._M_t.
               super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
               .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
      if (local_148.trees.
          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_148.trees.
          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_01 = isotree::IsolationForest::get_model_ext
                            ((IsolationForest *)
                             this.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        ExtIsoForest::operator=(this_01,&local_f8);
      }
      else {
        this_00 = isotree::IsolationForest::get_model
                            ((IsolationForest *)
                             this.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        IsoForest::operator=(this_00,&local_148);
      }
      if (local_a8.imputer_tree.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_a8.imputer_tree.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_02 = isotree::IsolationForest::get_imputer
                            ((IsolationForest *)
                             out._M_t.
                             super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                             .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl)
        ;
        Imputer::operator=(this_02,&local_a8);
      }
      if (local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_168.indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::_M_move_assign
                  ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                   ((long)out._M_t.
                          super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                          .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl +
                   0x1b8),&local_168);
      }
      uVar1._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           out._M_t.
           super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
           ._M_t.
           super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
           .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
      out._M_t.
      super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
      ._M_t.
      super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
      .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
           (__uniq_ptr_data<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>,_true,_true>
            )(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
              )0x0;
      std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
      ~unique_ptr(&out);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buffer_metadata);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&local_168.indices);
      Imputer::~Imputer(&local_a8);
      std::
      vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ::~vector(&local_f8.hplanes);
      std::
      vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ::~vector(&local_148.trees);
      return (void *)(__uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                      )uVar1._M_t.
                       super___uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
                       .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
    }
    prVar5 = (runtime_error *)
             __cxa_allocate_exception
                       (0x10,0x18,
                        ((long)local_168.indices.
                               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_168.indices.
                              super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                              _M_impl.super__Vector_impl_data._M_start) % 0x98);
    std::runtime_error::runtime_error(prVar5,"Error: indexer has incorrect number of trees.\n");
  }
  else {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10,0x18,lVar6 % 0x18);
    std::runtime_error::runtime_error(prVar5,"Error: imputer has incorrect number of trees.\n");
  }
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_raw(const char *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed NULL 'serialized_model' to 'isotree_deserialize_from_raw'." << std::endl;
        return nullptr;
    }

    try
    {
        bool is_isotree_model = false;
        bool is_compatible = false;
        bool has_combined_objects = false;
        bool has_IsoForest = false;
        bool has_ExtIsoForest = false;
        bool has_Imputer = false;
        bool has_Indexer = false;
        bool has_metadata = false;
        size_t size_metadata = 0;
        inspect_serialized_object(
            serialized_model,
            is_isotree_model,
            is_compatible,
            has_combined_objects,
            has_IsoForest,
            has_ExtIsoForest,
            has_Imputer,
            has_Indexer,
            has_metadata,
            size_metadata
        );
        if (is_isotree_model && is_compatible && !has_combined_objects)
            throw std::runtime_error("Serialized model is not compatible.\n");

        IsoForest model = IsoForest();
        ExtIsoForest model_ext = ExtIsoForest();
        Imputer imputer = Imputer();
        TreesIndexer indexer = TreesIndexer();

        std::unique_ptr<char[]> buffer_metadata;
        if (size_metadata) {
            buffer_metadata = std::unique_ptr<char[]>(new char[size_metadata]);
        }

        deserialize_combined(
            serialized_model,
            &model,
            &model_ext,
            &imputer,
            &indexer,
            size_metadata? buffer_metadata.get() : (char*)nullptr
        );

        if (!model.trees.size() && !model_ext.hplanes.size())
            throw std::runtime_error("Error: model contains no trees.\n");

        size_t ntrees;
        size_t ndim = 3;
        bool build_imputer = false;

        if (!model.trees.empty()) {
            ntrees = model.trees.size();
            ndim = 1;
        }
        else {
            ntrees = model_ext.hplanes.size();
        }
        if (!imputer.imputer_tree.empty()) {
            if (imputer.imputer_tree.size() != ntrees)
                throw std::runtime_error("Error: imputer has incorrect number of trees.\n");
            build_imputer = true;
        }
        if (!indexer.indices.empty()) {
            if (indexer.indices.size() != ntrees)
                throw std::runtime_error("Error: indexer has incorrect number of trees.\n");
        }

        std::unique_ptr<IsolationForest> out(new IsolationForest());
        out->nthreads = nthreads;
        out->ndim = ndim;
        out->ntrees = ntrees;
        out->build_imputer = build_imputer;

        if (!model.trees.empty())
            out->get_model() = std::move(model);
        else
            out->get_model_ext() = std::move(model_ext);
        if (!imputer.imputer_tree.empty())
            out->get_imputer() = std::move(imputer);
        if (!indexer.indices.empty())
            out->indexer = std::move(indexer);

        return out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}